

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase149::run(TestCase149 *this)

{
  int local_90;
  bool local_89;
  int local_88;
  bool _kj_shouldLog_4;
  int local_80;
  bool _kj_shouldLog_3;
  undefined1 local_78 [7];
  bool _kj_shouldLog_2;
  int local_60;
  bool local_5a;
  bool local_59;
  int local_58;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  int i;
  undefined1 local_48 [8];
  ArrayBuilder<kj::(anonymous_namespace)::TestObject> builder;
  Array<kj::(anonymous_namespace)::TestObject> array;
  TestCase149 *this_local;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  Array<kj::(anonymous_namespace)::TestObject>::Array
            ((Array<kj::(anonymous_namespace)::TestObject> *)&builder.disposer);
  heapArrayBuilder<kj::(anonymous_namespace)::TestObject>
            ((ArrayBuilder<kj::(anonymous_namespace)::TestObject> *)local_48,0x20);
  for (local_58 = 0; local_58 < 0x20; local_58 = local_58 + 1) {
    if (local_58 != (anonymous_namespace)::TestObject::count) {
      local_59 = _::Debug::shouldLog(ERROR);
      while (local_59 != false) {
        _::Debug::log<char_const(&)[44],int&,int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                   ,0x9f,ERROR,
                   "\"failed: expected \" \"(i) == (TestObject::count)\", i, TestObject::count",
                   (char (*) [44])"failed: expected (i) == (TestObject::count)",&local_58,
                   &(anonymous_namespace)::TestObject::count);
        local_59 = false;
      }
    }
    ArrayBuilder<kj::(anonymous_namespace)::TestObject>::add<>
              ((ArrayBuilder<kj::(anonymous_namespace)::TestObject> *)local_48);
  }
  if ((anonymous_namespace)::TestObject::count != 0x20) {
    local_5a = _::Debug::shouldLog(ERROR);
    while (local_5a != false) {
      local_60 = 0x20;
      _::Debug::log<char_const(&)[45],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0xa3,ERROR,
                 "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
                 (char (*) [45])"failed: expected (32) == (TestObject::count)",&local_60,
                 &(anonymous_namespace)::TestObject::count);
      local_5a = false;
    }
  }
  ArrayBuilder<kj::(anonymous_namespace)::TestObject>::finish
            ((Array<kj::(anonymous_namespace)::TestObject> *)local_78,
             (ArrayBuilder<kj::(anonymous_namespace)::TestObject> *)local_48);
  Array<kj::(anonymous_namespace)::TestObject>::operator=
            ((Array<kj::(anonymous_namespace)::TestObject> *)&builder.disposer,
             (Array<kj::(anonymous_namespace)::TestObject> *)local_78);
  Array<kj::(anonymous_namespace)::TestObject>::~Array
            ((Array<kj::(anonymous_namespace)::TestObject> *)local_78);
  if ((anonymous_namespace)::TestObject::count != 0x20) {
    _kj_shouldLog_3 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_3 != false) {
      local_80 = 0x20;
      _::Debug::log<char_const(&)[45],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0xa5,ERROR,
                 "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
                 (char (*) [45])"failed: expected (32) == (TestObject::count)",&local_80,
                 &(anonymous_namespace)::TestObject::count);
      _kj_shouldLog_3 = false;
    }
  }
  ArrayBuilder<kj::(anonymous_namespace)::TestObject>::~ArrayBuilder
            ((ArrayBuilder<kj::(anonymous_namespace)::TestObject> *)local_48);
  if ((anonymous_namespace)::TestObject::count != 0x20) {
    _kj_shouldLog_4 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      local_88 = 0x20;
      _::Debug::log<char_const(&)[45],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0xa8,ERROR,
                 "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
                 (char (*) [45])"failed: expected (32) == (TestObject::count)",&local_88,
                 &(anonymous_namespace)::TestObject::count);
      _kj_shouldLog_4 = false;
    }
  }
  Array<kj::(anonymous_namespace)::TestObject>::operator=
            ((Array<kj::(anonymous_namespace)::TestObject> *)&builder.disposer,(void *)0x0);
  if ((anonymous_namespace)::TestObject::count != 0) {
    local_89 = _::Debug::shouldLog(ERROR);
    while (local_89 != false) {
      local_90 = 0;
      _::Debug::log<char_const(&)[44],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0xaa,ERROR,
                 "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
                 (char (*) [44])"failed: expected (0) == (TestObject::count)",&local_90,
                 &(anonymous_namespace)::TestObject::count);
      local_89 = false;
    }
  }
  Array<kj::(anonymous_namespace)::TestObject>::~Array
            ((Array<kj::(anonymous_namespace)::TestObject> *)&builder.disposer);
  return;
}

Assistant:

TEST(Array, AraryBuilder) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array;

  {
    ArrayBuilder<TestObject> builder = heapArrayBuilder<TestObject>(32);

    for (int i = 0; i < 32; i++) {
      EXPECT_EQ(i, TestObject::count);
      builder.add();
    }

    EXPECT_EQ(32, TestObject::count);
    array = builder.finish();
    EXPECT_EQ(32, TestObject::count);
  }

  EXPECT_EQ(32, TestObject::count);
  array = nullptr;
  EXPECT_EQ(0, TestObject::count);
}